

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,float>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  Variable<float> *pVVar4;
  pointer pcVar5;
  _func_int **pp_Var6;
  bool bVar7;
  bool bVar8;
  ContextType type;
  int iVar9;
  uint uVar10;
  undefined8 uVar11;
  char *__s;
  size_t sVar12;
  long *plVar13;
  ShaderExecutor *pSVar14;
  IVal *pIVar15;
  TestError *this_00;
  TestLog *pTVar16;
  size_t sVar17;
  IVal IVar18;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>
  *pVVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  IVal in1;
  FuncSet funcs;
  IVal in3;
  IVal in2;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_> outputs;
  ostringstream oss;
  ShaderSpec spec;
  undefined1 auStack_508 [8];
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>
  *local_500;
  string local_4f8;
  undefined1 local_4d8 [8];
  undefined8 local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4c8;
  _Rb_tree_node_base *local_4b8;
  size_t local_4b0;
  Statement *local_4a8;
  long local_4a0;
  size_t local_498;
  ulong local_490;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_488;
  FloatFormat *local_480;
  IVal local_478;
  IVal local_458;
  ResultCollector *local_440;
  undefined1 local_438 [8];
  undefined1 auStack_430 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_428;
  double local_418;
  Data local_410;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  FloatFormat local_2b8;
  ulong local_290;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_288;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [3];
  ios_base local_1b8 [272];
  undefined1 local_a8 [56];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pfVar2 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar17 = (long)pfVar3 - (long)pfVar2 >> 2;
  local_4a8 = stmt;
  local_488 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>::Outputs(&local_258,sVar17);
  local_70._M_p = (pointer)&local_60;
  local_a8._0_4_ = GLSL_VERSION_300_ES;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  local_a8._32_8_ = (pointer)0x0;
  local_a8._40_8_ = (pointer)0x0;
  local_a8._48_8_ = (pointer)0x0;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_288._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_288._M_impl.super__Rb_tree_header._M_header;
  local_288._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_288._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_288._M_impl.super__Rb_tree_header._M_header._M_right =
       local_288._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"Statement: ",0xb);
  (*local_4a8->_vptr_Statement[2])(local_4a8,(ostringstream *)auStack_430);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_500 = variables;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  local_4d0 = (double)((ulong)local_4d0._4_4_ << 0x20);
  aStack_4c8._M_allocated_capacity = 0;
  local_4b0 = 0;
  aStack_4c8._8_8_ = (_Rb_tree_node_base *)&local_4d0;
  local_4b8 = (_Rb_tree_node_base *)&local_4d0;
  local_498 = sVar17;
  (*local_4a8->_vptr_Statement[4])(local_4a8,local_4d8);
  if ((_Rb_tree_node_base *)aStack_4c8._8_8_ != (_Rb_tree_node_base *)&local_4d0) {
    uVar11 = aStack_4c8._8_8_;
    do {
      (**(code **)(**(long **)(uVar11 + 0x20) + 0x30))(*(long **)(uVar11 + 0x20),local_228);
      uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
    } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&local_4d0);
  }
  pVVar19 = local_500;
  if (local_4b0 != 0) {
    local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_430,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_430,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  __s = glu::getPrecisionName((this->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_508 + (long)((TestLog *)((long)local_438 + -0x18))->m_log) + 0xd0)
    ;
  }
  else {
    sVar12 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,__s,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_70,(string *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
    operator_delete(local_228[0]._M_dataplus._M_p,local_228[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_a8._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+(local_228,"#extension ",&this->m_extension);
    plVar13 = (long *)std::__cxx11::string::append((char *)local_228);
    pTVar16 = (TestLog *)(plVar13 + 2);
    if ((TestLog *)*plVar13 == pTVar16) {
      aStack_428._M_allocated_capacity = (size_type)pTVar16->m_log;
      aStack_428._8_8_ = plVar13[3];
      local_438 = (undefined1  [8])(auStack_430 + 8);
    }
    else {
      aStack_428._M_allocated_capacity = (size_type)pTVar16->m_log;
      local_438 = (undefined1  [8])*plVar13;
    }
    auStack_430 = (undefined1  [8])plVar13[1];
    *plVar13 = (long)pTVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_438);
    if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
      operator_delete((void *)local_438,(ulong)(aStack_428._M_allocated_capacity + 1));
    }
    pVVar19 = local_500;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
      operator_delete(local_228[0]._M_dataplus._M_p,local_228[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 8),1);
  makeSymbol<float>((Symbol *)local_438,this,
                    (pVVar19->in0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_a8._8_8_;
  std::__cxx11::string::operator=((string *)local_a8._8_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(aStack_428._M_allocated_capacity + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 0x20),2);
  makeSymbol<float>((Symbol *)local_438,this,
                    (pVVar19->out1).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_a8._32_8_;
  std::__cxx11::string::operator=((string *)(local_a8._32_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar11 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(aStack_428._M_allocated_capacity + 1));
  }
  makeSymbol<float>((Symbol *)local_438,this,
                    (pVVar19->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_a8._32_8_;
  std::__cxx11::string::operator=((string *)local_a8._32_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(aStack_428._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  (*local_4a8->_vptr_Statement[2])(local_4a8,local_438);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::__cxx11::string::operator=((string *)&local_50,(string *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
    operator_delete(local_228[0]._M_dataplus._M_p,local_228[0].field_2._M_allocated_capacity + 1);
  }
  pSVar14 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_a8);
  sVar17 = local_498;
  local_438 = (undefined1  [8])
              (local_488->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  auStack_430 = (undefined1  [8])
                (local_488->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  aStack_428._M_allocated_capacity =
       (size_type)
       (local_488->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  aStack_428._8_8_ =
       (local_488->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228[0]._M_dataplus._M_p =
       (pointer)local_258.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_228[0]._M_string_length =
       (size_type)
       local_258.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar14->_vptr_ShaderExecutor[3])
            (pSVar14,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar9 = (*pSVar14->_vptr_ShaderExecutor[2])(pSVar14);
  if ((char)iVar9 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar14->_vptr_ShaderExecutor[5])(pSVar14);
  (*pSVar14->_vptr_ShaderExecutor[6])(pSVar14,sVar17 & 0xffffffff,local_438);
  (*pSVar14->_vptr_ShaderExecutor[1])(pSVar14);
  local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffffffffff00);
  auStack_430 = (undefined1  [8])0x7ff0000000000000;
  aStack_428._M_allocated_capacity = 0xfff0000000000000;
  local_228[0]._M_dataplus._M_p = local_228[0]._M_dataplus._M_p & 0xffffffffffffff00;
  local_228[0]._M_string_length = 0x7ff0000000000000;
  local_228[0].field_2._M_allocated_capacity = -INFINITY;
  local_4d8[0] = false;
  local_4d0 = INFINITY;
  aStack_4c8._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<float>
            ((Environment *)&local_288,
             (pVVar19->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_438);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_288,
             (pVVar19->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4f8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_288,
             (pVVar19->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_458);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_288,
             (pVVar19->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_478);
  Environment::bind<float>
            ((Environment *)&local_288,
             (pVVar19->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_228);
  Environment::bind<float>
            ((Environment *)&local_288,
             (pVVar19->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_4d8);
  if (pfVar3 == pfVar2) {
LAB_016d5336:
    local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_480 = &(this->m_ctx).floatFormat;
    local_440 = &this->m_status;
    local_290 = sVar17 + (sVar17 == 0);
    local_4a0 = 0;
    uVar20 = 0;
    local_490 = 0;
    do {
      local_458._0_8_ = local_458._0_8_ & 0xffffffffffffff00;
      local_458.m_lo = INFINITY;
      local_458.m_hi = -INFINITY;
      local_478._0_8_ = local_478._0_8_ & 0xffffffffffffff00;
      local_478.m_lo = INFINITY;
      local_478.m_hi = -INFINITY;
      if ((uVar20 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestNode.m_testCtx);
      }
      fVar1 = (local_488->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20];
      pp_Var6 = (_func_int **)(double)fVar1;
      bVar7 = NAN(fVar1);
      local_438[0] = bVar7;
      auStack_430 = (undefined1  [8])(_func_int **)0x7ff0000000000000;
      if (!bVar7) {
        auStack_430 = (undefined1  [8])pp_Var6;
      }
      aStack_428._M_allocated_capacity = (size_type)(_func_int **)0xfff0000000000000;
      if (!bVar7) {
        aStack_428._M_allocated_capacity = (size_type)pp_Var6;
      }
      tcu::FloatFormat::roundOut((Interval *)local_4d8,local_480,(Interval *)local_438,false);
      tcu::FloatFormat::convert((Interval *)local_228,local_480,(Interval *)local_4d8);
      pIVar15 = Environment::lookup<float>
                          ((Environment *)&local_288,
                           (local_500->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pVVar19 = local_500;
      pIVar15->m_hi = (double)local_228[0].field_2._0_8_;
      *(pointer *)pIVar15 = local_228[0]._M_dataplus._M_p;
      pIVar15->m_lo = (double)local_228[0]._M_string_length;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_288,
                 (local_500->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_288,
                 (pVVar19->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_288,
                 (pVVar19->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_410.basic.type = (this->m_ctx).precision;
      local_418 = local_480->m_maxValue;
      local_438 = *(undefined1 (*) [8])local_480;
      auStack_430 = *(undefined1 (*) [8])&local_480->m_fractionBits;
      aStack_428._M_allocated_capacity = *(undefined8 *)&local_480->m_hasInf;
      aStack_428._8_8_ = *(undefined8 *)&local_480->m_exactPrecision;
      local_400 = 0;
      local_410._8_8_ = &local_288;
      (*local_4a8->_vptr_Statement[3])(local_4a8,(MessageBuilder *)local_438);
      pIVar15 = Environment::lookup<float>
                          ((Environment *)&local_288,
                           (local_500->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      tcu::FloatFormat::convert((Interval *)local_438,&local_2b8,pIVar15);
      local_478.m_hi = (double)aStack_428._M_allocated_capacity;
      local_478._0_8_ = local_438;
      uVar11 = local_478._0_8_;
      local_478.m_lo = (double)auStack_430;
      fVar1 = local_258.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20];
      dVar21 = (double)fVar1;
      dVar22 = dVar21;
      if (NAN(fVar1)) {
        dVar22 = INFINITY;
        dVar21 = -INFINITY;
      }
      IVar18 = (IVal)(dVar21 <= (double)aStack_428._M_allocated_capacity &&
                     (double)auStack_430 <= dVar22);
      if ((NAN(fVar1)) &&
         (dVar21 <= (double)aStack_428._M_allocated_capacity && (double)auStack_430 <= dVar22)) {
        local_478.m_hasNaN = local_438[0];
        IVar18 = (IVal)local_478.m_hasNaN;
      }
      local_438 = (undefined1  [8])(auStack_430 + 8);
      local_478._0_8_ = uVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 1 is outside acceptable range","");
      bVar7 = tcu::ResultCollector::check(local_440,(bool)((byte)IVar18 & 1),(string *)local_438);
      if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
        operator_delete((void *)local_438,aStack_428._M_allocated_capacity + 1);
      }
      pIVar15 = Environment::lookup<float>
                          ((Environment *)&local_288,
                           (local_500->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      tcu::FloatFormat::convert((Interval *)local_438,&local_2b8,pIVar15);
      local_458.m_hi = (double)aStack_428._M_allocated_capacity;
      local_458._0_8_ = local_438;
      uVar11 = local_458._0_8_;
      local_458.m_lo = (double)auStack_430;
      fVar1 = local_258.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20];
      dVar21 = (double)fVar1;
      dVar22 = dVar21;
      if (NAN(fVar1)) {
        dVar22 = INFINITY;
        dVar21 = -INFINITY;
      }
      IVar18 = (IVal)(dVar21 <= (double)aStack_428._M_allocated_capacity &&
                     (double)auStack_430 <= dVar22);
      if ((NAN(fVar1)) &&
         (dVar21 <= (double)aStack_428._M_allocated_capacity && (double)auStack_430 <= dVar22)) {
        local_458.m_hasNaN = local_438[0];
        IVar18 = (IVal)local_458.m_hasNaN;
      }
      local_438 = (undefined1  [8])(auStack_430 + 8);
      local_458._0_8_ = uVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar8 = tcu::ResultCollector::check(local_440,(bool)((byte)IVar18 & 1),(string *)local_438);
      if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
        operator_delete((void *)local_438,aStack_428._M_allocated_capacity + 1);
      }
      if ((!bVar7 || !bVar8) &&
         (uVar10 = (int)local_490 + 1, local_490 = (ulong)uVar10, (int)uVar10 < 0x65)) {
        local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
        pVVar4 = (local_500->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_228[0]._M_dataplus._M_p,
                   local_228[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
        valueToString<float>
                  ((string *)local_4d8,&local_2b8,
                   (float *)((long)(local_488->in0).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start + local_4a0));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                   (long)local_4d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_4d8._1_7_,local_4d8[0]) != &aStack_4c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                          (ulong)(aStack_4c8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
          operator_delete(local_228[0]._M_dataplus._M_p,
                          local_228[0].field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
        pVVar4 = (local_500->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_228[0]._M_dataplus._M_p,
                   local_228[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
        valueToString<float>
                  ((string *)local_4d8,&local_2b8,
                   (float *)((long)local_258.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + local_4a0));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                   (long)local_4d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,"\tExpected range: ",0x11);
        intervalToString<float>(&local_4f8,&local_2b8,&local_458);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_4d8._1_7_,local_4d8[0]) != &aStack_4c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                          (ulong)(aStack_4c8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
          operator_delete(local_228[0]._M_dataplus._M_p,
                          local_228[0].field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
        pVVar4 = (local_500->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_228[0]._M_dataplus._M_p,
                   local_228[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
        valueToString<float>
                  ((string *)local_4d8,&local_2b8,
                   (float *)((long)local_258.out1.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + local_4a0));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                   (long)local_4d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,"\tExpected range: ",0x11);
        intervalToString<float>(&local_4f8,&local_2b8,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_4d8._1_7_,local_4d8[0]) != &aStack_4c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                          (ulong)(aStack_4c8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
          operator_delete(local_228[0]._M_dataplus._M_p,
                          local_228[0].field_2._M_allocated_capacity + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
        std::ios_base::~ios_base(local_3c0);
      }
      uVar20 = uVar20 + 1;
      local_4a0 = local_4a0 + 4;
    } while (local_290 != uVar20);
    iVar9 = (int)local_490;
    if (iVar9 < 0x65) {
      if (iVar9 == 0) goto LAB_016d5336;
    }
    else {
      local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)auStack_430,iVar9 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
      std::ios_base::~ios_base(local_3c0);
    }
    local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::ostream::operator<<((ostringstream *)auStack_430,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 8));
  if (local_258.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_258.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}